

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_unsigned_char_*,_int,_unsigned_short_*),_void_(*(*)(unsigned_char))(const_unsigned_char_*,_int,_unsigned_short_*),_void_(*(*)(unsigned_char))(const_unsigned_char_*,_int,_unsigned_short_*)>_>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_unsigned_char_*,_int,_unsigned_short_*),_void_(*(*)(unsigned_char))(const_unsigned_char_*,_int,_unsigned_short_*),_void_(*(*)(unsigned_char))(const_unsigned_char_*,_int,_unsigned_short_*)>_>
::Iterator::Clone(Iterator *this)

{
  Iterator *this_00;
  Iterator *in_RDI;
  
  this_00 = (Iterator *)operator_new(0x20);
  Iterator(this_00,in_RDI);
  return &this_00->
          super_ParamIteratorInterface<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_unsigned_char_*,_int,_unsigned_short_*),_void_(*(*)(unsigned_char))(const_unsigned_char_*,_int,_unsigned_short_*),_void_(*(*)(unsigned_char))(const_unsigned_char_*,_int,_unsigned_short_*)>_>
  ;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }